

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SameValueComparer.h
# Opt level: O0

hash_t Js::SameValueComparerCommon<void_*,_true>::GetHashCode(Var i)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int32 iVar4;
  charcount_t length;
  undefined4 *puVar5;
  RecyclableObject *this;
  JavascriptTypedNumber<long> *this_00;
  long lVar6;
  JavascriptString *this_01;
  char16 *s;
  double d_00;
  JavascriptString *v_1;
  double d_1;
  double d;
  long v;
  Var i_local;
  TypeId local_18;
  TypeId typeId;
  
  if (i == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(i);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(i);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      this = UnsafeVarTo<Js::RecyclableObject>(i);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(this);
      if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
  }
  switch(local_18) {
  case TypeIds_FirstNumberType:
    iVar4 = TaggedInt::ToInt32(i);
    i_local._4_4_ = HashDouble((double)iVar4);
    break;
  case TypeIds_Number:
    d_00 = JavascriptNumber::GetValue(i);
    i_local._4_4_ = HashDouble(d_00);
    break;
  case TypeIds_Int64Number:
  case TypeIds_LastNumberType:
    this_00 = VarTo<Js::JavascriptTypedNumber<long>>(i);
    lVar6 = JavascriptTypedNumber<long>::GetValue(this_00);
    if (lVar6 == (long)(double)lVar6) {
      i_local._4_4_ = HashDouble((double)lVar6);
    }
    else {
      i_local._4_4_ = (uint)lVar6 ^ (uint)((ulong)lVar6 >> 0x20);
    }
    break;
  case TypeIds_String:
    this_01 = UnsafeVarTo<Js::JavascriptString>(i);
    s = JavascriptString::GetString(this_01);
    length = JavascriptString::GetLength(this_01);
    i_local._4_4_ = JsUtil::CharacterBuffer<char16_t>::StaticGetHashCode(s,length);
    break;
  default:
    i_local._4_4_ = RecyclerPointerComparer<void_*>::GetHashCode(i);
  }
  return i_local._4_4_;
}

Assistant:

static hash_t GetHashCode(Var i)
        {
            switch (JavascriptOperators::GetTypeId(i))
            {
            case TypeIds_Integer:
                // int32 can be fully represented in a double, so hash it as a double
                // to ensure that tagged ints hash to the same value as JavascriptNumbers.
                return HashDouble((double)TaggedInt::ToInt32(i));

            case TypeIds_Int64Number:
            case TypeIds_UInt64Number:
                {
                    __int64 v = VarTo<JavascriptInt64Number>(i)->GetValue();
                    double d = (double) v;
                    if (v != (__int64) d)
                    {
                        // this int64 is too large to represent in a double
                        // and thus will never be equal to a double so hash it
                        // as an int64
                        return (uint)v ^ (uint)(v >> 32);
                    }

                    // otherwise hash it as a double
                    return HashDouble(d);
                }

            case TypeIds_Number:
                {
                    double d = JavascriptNumber::GetValue(i);
                    return HashDouble(d);
                }

            case TypeIds_String:
                {
                    JavascriptString* v = UnsafeVarTo<JavascriptString>(i);
                    return JsUtil::CharacterBuffer<WCHAR>::StaticGetHashCode(v->GetString(), v->GetLength());
                }

            default:
                return RecyclerPointerComparer<Var>::GetHashCode(i);
            }
        }